

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_CompareVars_Test::TestBody(ProblemTest_CompareVars_Test *this)

{
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  other;
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  other_00;
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  other_01;
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  other_02;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  BasicProblem<mp::BasicProblemParams<int>_> *assertion_result;
  BasicProblem<mp::BasicProblemParams<int>_> *actual_predicate_value;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Variable VVar16;
  MutVariable MVar17;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Problem p;
  undefined1 in_stack_fffffffffffff97f;
  undefined2 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff982;
  undefined1 in_stack_fffffffffffff983;
  undefined4 in_stack_fffffffffffff984;
  undefined4 in_stack_fffffffffffff988;
  int in_stack_fffffffffffff98c;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  undefined4 in_stack_fffffffffffff998;
  undefined4 uVar18;
  int in_stack_fffffffffffff99c;
  int line;
  undefined2 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a2;
  undefined1 in_stack_fffffffffffff9a3;
  undefined4 in_stack_fffffffffffff9a4;
  undefined8 in_stack_fffffffffffff9a8;
  Type TVar19;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  undefined8 in_stack_fffffffffffff9b8;
  Type type;
  undefined2 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c2;
  undefined1 in_stack_fffffffffffff9c3;
  undefined4 in_stack_fffffffffffff9c4;
  double in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  undefined2 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffffa00;
  string local_5d8 [48];
  BasicProblem<mp::BasicProblemParams<int>_> *local_5a8;
  int local_5a0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_598;
  int iStack_590;
  undefined4 uStack_58c;
  BasicProblem<mp::BasicProblemParams<int>_> *local_588;
  undefined8 uStack_580;
  BasicProblem<mp::BasicProblemParams<int>_> *local_578;
  int local_570;
  BasicProblem<mp::BasicProblemParams<int>_> *local_568;
  int local_560;
  AssertionResult local_558;
  string local_548 [48];
  BasicProblem<mp::BasicProblemParams<int>_> *local_518;
  int local_510;
  BasicProblem<mp::BasicProblemParams<int>_> *local_508;
  int iStack_500;
  undefined4 uStack_4fc;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4f8;
  undefined8 uStack_4f0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4e8;
  int local_4e0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4d8;
  int local_4d0;
  AssertionResult local_4c8;
  string local_4b8 [48];
  BasicProblem<mp::BasicProblemParams<int>_> *local_488;
  int local_480;
  BasicProblem<mp::BasicProblemParams<int>_> *local_478;
  int iStack_470;
  undefined4 uStack_46c;
  BasicProblem<mp::BasicProblemParams<int>_> *local_468;
  undefined8 uStack_460;
  BasicProblem<mp::BasicProblemParams<int>_> *local_458;
  int local_450;
  BasicProblem<mp::BasicProblemParams<int>_> *local_448;
  int local_440;
  AssertionResult local_438;
  string local_428 [48];
  BasicProblem<mp::BasicProblemParams<int>_> *local_3f8;
  int local_3f0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3e8;
  int iStack_3e0;
  undefined4 uStack_3dc;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3d8;
  undefined8 uStack_3d0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3c0;
  int local_3b8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3b0;
  int local_3a8;
  AssertionResult local_3a0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_390;
  int local_388;
  BasicProblem<mp::BasicProblemParams<int>_> *local_380;
  int local_378;
  
  TVar19 = (Type)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  type = (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(in_stack_fffffffffffff9a4,
                      CONCAT13(in_stack_fffffffffffff9a3,
                               CONCAT12(in_stack_fffffffffffff9a2,in_stack_fffffffffffff9a0))));
  VVar16 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                      in_stack_fffffffffffff9c8,
                      (double)CONCAT44(in_stack_fffffffffffff9c4,
                                       CONCAT13(in_stack_fffffffffffff9c3,
                                                CONCAT12(in_stack_fffffffffffff9c2,
                                                         in_stack_fffffffffffff9c0))),type);
  local_380 = VVar16.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_378 = VVar16.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  VVar16 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                      in_stack_fffffffffffff9c8,
                      (double)CONCAT44(in_stack_fffffffffffff9c4,
                                       CONCAT13(in_stack_fffffffffffff9c3,
                                                CONCAT12(in_stack_fffffffffffff9c2,
                                                         in_stack_fffffffffffff9c0))),type);
  local_390 = VVar16.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  iVar9 = VVar16.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
          index_;
  local_388 = iVar9;
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      in_stack_fffffffffffff98c);
  assertion_result =
       MVar17.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar10 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3c0 = assertion_result;
  local_3b8 = iVar10;
  local_3b0 = assertion_result;
  local_3a8 = iVar10;
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      in_stack_fffffffffffff98c);
  actual_predicate_value =
       MVar17.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar11 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uStack_3d0 = CONCAT44(uStack_3dc,iVar11);
  other_01.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_ =
       in_stack_fffffffffffff99c;
  other_01.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._0_4_ =
       in_stack_fffffffffffff998;
  other_01.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_._0_2_ =
       in_stack_fffffffffffff9a0;
  other_01.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_._2_1_ =
       in_stack_fffffffffffff9a2;
  other_01.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_._3_1_ =
       in_stack_fffffffffffff9a3;
  other_01.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ =
       in_stack_fffffffffffff9a4;
  local_3f8 = actual_predicate_value;
  local_3f0 = iVar11;
  local_3e8 = actual_predicate_value;
  iStack_3e0 = iVar11;
  local_3d8 = actual_predicate_value;
  uVar1 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),other_01);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT44(in_stack_fffffffffffff984,
                      CONCAT13(in_stack_fffffffffffff983,
                               CONCAT12(in_stack_fffffffffffff982,in_stack_fffffffffffff980))),
             (bool)in_stack_fffffffffffff97f);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3a0);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result,
               (char *)CONCAT44(iVar10,in_stack_fffffffffffff9f0),(char *)actual_predicate_value,
               (char *)CONCAT44(iVar11,CONCAT13(uVar1,CONCAT12(uVar2,in_stack_fffffffffffff9e0))));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),TVar19,
               (char *)CONCAT44(in_stack_fffffffffffff9a4,
                                CONCAT13(in_stack_fffffffffffff9a3,
                                         CONCAT12(in_stack_fffffffffffff9a2,
                                                  in_stack_fffffffffffff9a0))),
               in_stack_fffffffffffff99c,
               (char *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar9,in_stack_fffffffffffffa00),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT44(in_stack_fffffffffffff984,
                        CONCAT13(in_stack_fffffffffffff983,
                                 CONCAT12(in_stack_fffffffffffff982,in_stack_fffffffffffff980))));
    std::__cxx11::string::~string(local_428);
    testing::Message::~Message((Message *)0x11490a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114985);
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      in_stack_fffffffffffff98c);
  local_458 = MVar17.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_450 = MVar17.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_448 = local_458;
  local_440 = local_450;
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      in_stack_fffffffffffff98c);
  local_488 = MVar17.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_480 = MVar17.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uStack_460 = CONCAT44(uStack_46c,local_480);
  other.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_ =
       in_stack_fffffffffffff98c;
  other.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._0_4_ =
       in_stack_fffffffffffff988;
  other.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       in_stack_fffffffffffff990;
  other.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ =
       in_stack_fffffffffffff994;
  local_478 = local_488;
  iStack_470 = local_480;
  local_468 = local_488;
  mp::BasicProblem<mp::BasicProblemParams<int>>::
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
  ::operator!=((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff984,
                           CONCAT13(in_stack_fffffffffffff983,
                                    CONCAT12(in_stack_fffffffffffff982,in_stack_fffffffffffff980))),
               other);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT44(in_stack_fffffffffffff984,
                      CONCAT13(in_stack_fffffffffffff983,
                               CONCAT12(in_stack_fffffffffffff982,in_stack_fffffffffffff980))),
             (bool)in_stack_fffffffffffff97f);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_438);
  if (!bVar3) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result,
               (char *)CONCAT44(iVar10,in_stack_fffffffffffff9f0),(char *)actual_predicate_value,
               (char *)CONCAT44(iVar11,CONCAT13(uVar1,CONCAT12(uVar2,in_stack_fffffffffffff9e0))));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),TVar19,
               (char *)CONCAT44(in_stack_fffffffffffff9a4,
                                CONCAT13(in_stack_fffffffffffff9a3,
                                         CONCAT12(in_stack_fffffffffffff9a2,
                                                  in_stack_fffffffffffff9a0))),
               in_stack_fffffffffffff99c,
               (char *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar9,in_stack_fffffffffffffa00),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT44(in_stack_fffffffffffff984,
                        CONCAT13(in_stack_fffffffffffff983,
                                 CONCAT12(in_stack_fffffffffffff982,in_stack_fffffffffffff980))));
    std::__cxx11::string::~string(local_4b8);
    testing::Message::~Message((Message *)0x114b69);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114be4);
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      in_stack_fffffffffffff98c);
  local_4e8 = MVar17.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar12 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_4e0 = iVar12;
  local_4d8 = local_4e8;
  local_4d0 = iVar12;
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      in_stack_fffffffffffff98c);
  pBVar8 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar13 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uStack_4f0 = CONCAT44(uStack_4fc,iVar13);
  other_00.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_ =
       in_stack_fffffffffffff98c;
  other_00.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._0_4_ =
       in_stack_fffffffffffff988;
  other_00.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       in_stack_fffffffffffff990;
  other_00.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ =
       in_stack_fffffffffffff994;
  local_518 = pBVar8;
  local_510 = iVar13;
  local_508 = pBVar8;
  iStack_500 = iVar13;
  local_4f8 = pBVar8;
  uVar4 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator!=((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff984,
                                   CONCAT13(in_stack_fffffffffffff983,
                                            CONCAT12(in_stack_fffffffffffff982,
                                                     in_stack_fffffffffffff980))),other_00);
  TVar19 = (Type)((ulong)pBVar8 >> 0x20);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT44(in_stack_fffffffffffff984,
                      CONCAT13(in_stack_fffffffffffff983,
                               CONCAT12(in_stack_fffffffffffff982,in_stack_fffffffffffff980))),
             (bool)in_stack_fffffffffffff97f);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
  if (!(bool)uVar5) {
    testing::Message::Message((Message *)CONCAT44(iVar12,in_stack_fffffffffffff9b0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result,
               (char *)CONCAT44(iVar10,in_stack_fffffffffffff9f0),(char *)actual_predicate_value,
               (char *)CONCAT44(iVar11,CONCAT13(uVar1,CONCAT12(uVar2,in_stack_fffffffffffff9e0))));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar12,in_stack_fffffffffffff9b0),TVar19,
               (char *)CONCAT44(iVar13,CONCAT13(uVar4,CONCAT12(uVar5,in_stack_fffffffffffff9a0))),
               in_stack_fffffffffffff99c,
               (char *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar9,in_stack_fffffffffffffa00),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT44(in_stack_fffffffffffff984,
                        CONCAT13(in_stack_fffffffffffff983,
                                 CONCAT12(in_stack_fffffffffffff982,in_stack_fffffffffffff980))));
    std::__cxx11::string::~string(local_548);
    testing::Message::~Message((Message *)0x114dc7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114e42);
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      in_stack_fffffffffffff98c);
  local_578 = MVar17.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar14 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uVar18 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._0_4_;
  line = MVar17.
         super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_;
  local_570 = iVar14;
  local_568 = local_578;
  local_560 = iVar14;
  MVar17 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                     ((BasicProblem<mp::BasicProblemParams<int>_> *)
                      CONCAT44(iVar14,in_stack_fffffffffffff990),in_stack_fffffffffffff98c);
  local_5a8 = MVar17.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar15 = MVar17.
           super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uStack_580 = CONCAT44(uStack_58c,iVar15);
  other_02.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_ =
       line;
  other_02.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._0_4_ =
       uVar18;
  other_02.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_._0_2_ =
       in_stack_fffffffffffff9a0;
  other_02.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_._2_1_ =
       uVar5;
  other_02.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_._3_1_ =
       uVar4;
  other_02.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = iVar13;
  local_5a0 = iVar15;
  local_598 = local_5a8;
  iStack_590 = iVar15;
  local_588 = local_5a8;
  uVar6 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)CONCAT44(iVar14,in_stack_fffffffffffff990),other_02);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT44(iVar15,CONCAT13(uVar6,CONCAT12(in_stack_fffffffffffff982,
                                                     in_stack_fffffffffffff980))),
             (bool)in_stack_fffffffffffff97f);
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_558);
  if (!(bool)uVar7) {
    testing::Message::Message((Message *)CONCAT44(iVar12,in_stack_fffffffffffff9b0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result,
               (char *)CONCAT44(iVar10,in_stack_fffffffffffff9f0),(char *)actual_predicate_value,
               (char *)CONCAT44(iVar11,CONCAT13(uVar1,CONCAT12(uVar2,in_stack_fffffffffffff9e0))));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar12,in_stack_fffffffffffff9b0),TVar19,
               (char *)CONCAT44(iVar13,CONCAT13(uVar4,CONCAT12(uVar5,in_stack_fffffffffffff9a0))),
               line,(char *)CONCAT44(iVar14,in_stack_fffffffffffff990));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar9,in_stack_fffffffffffffa00),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT44(iVar15,CONCAT13(uVar6,CONCAT12(uVar7,in_stack_fffffffffffff980))));
    std::__cxx11::string::~string(local_5d8);
    testing::Message::~Message((Message *)0x115028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1150a0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(iVar15,CONCAT13(uVar6,CONCAT12(uVar7,in_stack_fffffffffffff980))));
  return;
}

Assistant:

TEST(ProblemTest, CompareVars) {
  Problem p;
  p.AddVar(0, 0);
  p.AddVar(0, 0);
  EXPECT_TRUE(p.var(0) == p.var(0));
  EXPECT_TRUE(p.var(0) != p.var(1));
  EXPECT_FALSE(p.var(0) != p.var(0));
  EXPECT_FALSE(p.var(0) == p.var(1));
}